

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

TValue * lj_tab_setstr(lua_State *L,GCtab *t,GCstr *key)

{
  TValue *pTVar1;
  TValue *local_b8;
  Node *n;
  TValue k;
  GCstr *key_local;
  GCtab *t_local;
  lua_State *L_local;
  uint64_t local_88;
  Node *n_1;
  GCtab *local_78;
  GCstr *local_70;
  Node **local_68;
  lua_State *local_60;
  undefined4 local_54;
  GCstr *local_50;
  Node **local_48;
  lua_State *local_40;
  char *local_38;
  Node **local_30;
  lua_State *local_28;
  undefined4 local_1c;
  GCstr *local_18;
  Node **local_10;
  
  n_1._4_4_ = key->sid;
  local_88 = (t->node).ptr64;
  local_b8 = (TValue *)(local_88 + (ulong)(n_1._4_4_ & t->hmask) * 0x18);
  while (((int)local_b8[1].field_4.it >> 0xf != -5 ||
         ((GCstr *)(local_b8[1].u64 & 0x7fffffffffff) != key))) {
    local_b8 = (TValue *)local_b8[2].u64;
    if (local_b8 == (TValue *)0x0) {
      local_68 = &n;
      local_54 = 0xfffffffb;
      local_1c = 0xfffffffb;
      n = (Node *)((ulong)key | 0xfffd800000000000);
      local_38 = "store to dead GC object";
      k = (TValue)key;
      key_local = (GCstr *)t;
      t_local = (GCtab *)L;
      local_78 = t;
      local_70 = key;
      local_60 = L;
      local_50 = key;
      local_48 = local_68;
      local_40 = L;
      local_30 = local_68;
      local_28 = L;
      local_18 = key;
      local_10 = local_68;
      pTVar1 = lj_tab_newkey(L,t,(cTValue *)&n);
      return pTVar1;
    }
  }
  return local_b8;
}

Assistant:

TValue *lj_tab_setstr(lua_State *L, GCtab *t, const GCstr *key)
{
  TValue k;
  Node *n = hashstr(t, key);
  do {
    if (tvisstr(&n->key) && strV(&n->key) == key)
      return &n->val;
  } while ((n = nextnode(n)));
  setstrV(L, &k, key);
  return lj_tab_newkey(L, t, &k);
}